

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prelu_x86_avx512.cpp
# Opt level: O2

int __thiscall
ncnn::PReLU_x86_avx512::forward_inplace(PReLU_x86_avx512 *this,Mat *bottom_top_blob,Option *opt)

{
  float fVar1;
  uint uVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  void *pvVar5;
  uint *puVar6;
  float *pfVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  int iVar11;
  ulong uVar12;
  undefined1 (*pauVar13) [64];
  ulong uVar14;
  long lVar15;
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [32];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  
  iVar11 = bottom_top_blob->elempack;
  iVar9 = bottom_top_blob->dims;
  iVar8 = bottom_top_blob->w;
  uVar2 = bottom_top_blob->h;
  if (iVar9 == 3) {
    iVar9 = iVar8 * iVar11 * uVar2;
    pp_Var3 = this->_vptr_PReLU_x86_avx512;
    uVar14 = 0;
    uVar12 = (ulong)(uint)bottom_top_blob->c;
    if (bottom_top_blob->c < 1) {
      uVar12 = uVar14;
    }
    for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
      pfVar7 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar19 = *pfVar7;
        auVar23._4_4_ = fVar19;
        auVar23._0_4_ = fVar19;
        auVar23._8_4_ = fVar19;
        auVar23._12_4_ = fVar19;
LAB_002f9858:
        auVar16 = ZEXT3264(CONCAT1616(auVar23,auVar23));
LAB_002f985e:
        auVar25 = auVar16._0_32_;
        auVar16 = vinsertf64x4_avx512f(auVar16,auVar25,1);
      }
      else {
        fVar19 = pfVar7[uVar14];
        if (iVar11 == 4) {
          auVar23 = *(undefined1 (*) [16])(pfVar7 + uVar14 * 4);
          goto LAB_002f9858;
        }
        auVar23._4_4_ = fVar19;
        auVar23._0_4_ = fVar19;
        auVar23._8_4_ = fVar19;
        auVar23._12_4_ = fVar19;
        if (iVar11 == 8) {
          auVar16 = ZEXT3264(*(undefined1 (*) [32])(pfVar7 + uVar14 * 8));
          goto LAB_002f985e;
        }
        auVar25._4_4_ = fVar19;
        auVar25._0_4_ = fVar19;
        auVar25._8_4_ = fVar19;
        auVar25._12_4_ = fVar19;
        auVar25._16_4_ = fVar19;
        auVar25._20_4_ = fVar19;
        auVar25._24_4_ = fVar19;
        auVar25._28_4_ = fVar19;
        auVar16 = ZEXT3264(auVar25);
        if (iVar11 != 0x10) goto LAB_002f985e;
        auVar16 = *(undefined1 (*) [64])(pfVar7 + uVar14 * 0x10);
      }
      pauVar13 = (undefined1 (*) [64])
                 (bottom_top_blob->cstep * uVar14 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar8 = 0; iVar8 + 0xf < iVar9; iVar8 = iVar8 + 0x10) {
        auVar17 = vmaxps_avx512f(*pauVar13,ZEXT864(0));
        auVar18 = vminps_avx512f(*pauVar13,ZEXT864(0));
        auVar17 = vfmadd213ps_avx512f(auVar18,auVar16,auVar17);
        *pauVar13 = auVar17;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar8 + 7 < iVar9; iVar8 = iVar8 + 8) {
        auVar24 = vmaxps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar21 = vminps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar22 = vfmadd213ps_fma(auVar21,auVar25,auVar24);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar22);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar8 + 3 < iVar9; iVar8 = iVar8 + 4) {
        auVar22 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar20 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar22 = vfmadd213ps_fma(auVar20,auVar23,auVar22);
        *(undefined1 (*) [16])*pauVar13 = auVar22;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar8 < iVar9; iVar8 = iVar8 + 1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar19;
        }
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  else if (iVar9 == 2) {
    iVar8 = iVar8 * iVar11;
    pp_Var3 = this->_vptr_PReLU_x86_avx512;
    uVar14 = 0;
    uVar12 = (ulong)uVar2;
    if ((int)uVar2 < 1) {
      uVar12 = uVar14;
    }
    for (; uVar14 != uVar12; uVar14 = uVar14 + 1) {
      pfVar7 = *(float **)(&this->field_0xd8 + (long)pp_Var3[-3]);
      if (*(int *)(&this->field_0xd0 + (long)pp_Var3[-3]) < 2) {
        fVar19 = *pfVar7;
        auVar22._4_4_ = fVar19;
        auVar22._0_4_ = fVar19;
        auVar22._8_4_ = fVar19;
        auVar22._12_4_ = fVar19;
LAB_002f96e3:
        auVar16 = ZEXT3264(CONCAT1616(auVar22,auVar22));
LAB_002f96e9:
        auVar24 = auVar16._0_32_;
        auVar16 = vinsertf64x4_avx512f(auVar16,auVar24,1);
      }
      else {
        fVar19 = pfVar7[uVar14];
        if (iVar11 == 4) {
          auVar22 = *(undefined1 (*) [16])(pfVar7 + uVar14 * 4);
          goto LAB_002f96e3;
        }
        auVar22._4_4_ = fVar19;
        auVar22._0_4_ = fVar19;
        auVar22._8_4_ = fVar19;
        auVar22._12_4_ = fVar19;
        if (iVar11 == 8) {
          auVar16 = ZEXT3264(*(undefined1 (*) [32])(pfVar7 + uVar14 * 8));
          goto LAB_002f96e9;
        }
        auVar24._4_4_ = fVar19;
        auVar24._0_4_ = fVar19;
        auVar24._8_4_ = fVar19;
        auVar24._12_4_ = fVar19;
        auVar24._16_4_ = fVar19;
        auVar24._20_4_ = fVar19;
        auVar24._24_4_ = fVar19;
        auVar24._28_4_ = fVar19;
        auVar16 = ZEXT3264(auVar24);
        if (iVar11 != 0x10) goto LAB_002f96e9;
        auVar16 = *(undefined1 (*) [64])(pfVar7 + uVar14 * 0x10);
      }
      pauVar13 = (undefined1 (*) [64])
                 ((long)bottom_top_blob->w * uVar14 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      for (iVar9 = 0; iVar9 + 0xf < iVar8; iVar9 = iVar9 + 0x10) {
        auVar17 = vmaxps_avx512f(*pauVar13,ZEXT864(0));
        auVar18 = vminps_avx512f(*pauVar13,ZEXT864(0));
        auVar17 = vfmadd213ps_avx512f(auVar18,auVar16,auVar17);
        *pauVar13 = auVar17;
        pauVar13 = pauVar13 + 1;
      }
      for (; iVar9 + 7 < iVar8; iVar9 = iVar9 + 8) {
        auVar25 = vmaxps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar21 = vminps_avx(*(undefined1 (*) [32])*pauVar13,ZEXT832(0));
        auVar23 = vfmadd213ps_fma(auVar21,auVar24,auVar25);
        *(undefined1 (*) [32])*pauVar13 = ZEXT1632(auVar23);
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x20);
      }
      for (; iVar9 + 3 < iVar8; iVar9 = iVar9 + 4) {
        auVar23 = vmaxps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar20 = vminps_avx(*(undefined1 (*) [16])*pauVar13,ZEXT816(0));
        auVar23 = vfmadd213ps_fma(auVar20,auVar22,auVar23);
        *(undefined1 (*) [16])*pauVar13 = auVar23;
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 0x10);
      }
      for (; iVar9 < iVar8; iVar9 = iVar9 + 1) {
        if (*(float *)*pauVar13 < 0.0) {
          *(float *)*pauVar13 = *(float *)*pauVar13 * fVar19;
        }
        pauVar13 = (undefined1 (*) [64])(*pauVar13 + 4);
      }
    }
  }
  else if (iVar9 == 1) {
    iVar11 = iVar11 * iVar8;
    pp_Var3 = this->_vptr_PReLU_x86_avx512;
    p_Var4 = pp_Var3[-3];
    pvVar5 = bottom_top_blob->data;
    puVar6 = *(uint **)(&this->field_0xd8 + (long)p_Var4);
    if (*(int *)(&this->field_0xd0 + (long)p_Var4) < 2) {
      auVar16 = vbroadcastss_avx512f(ZEXT416(*puVar6));
      iVar9 = (int)((long)iVar11 / 0x10);
      lVar10 = 0;
      uVar12 = 0;
      if (0 < iVar9) {
        uVar12 = (long)iVar11 / 0x10 & 0xffffffff;
      }
      for (; uVar12 * 0x40 != lVar10; lVar10 = lVar10 + 0x40) {
        auVar17 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar10),ZEXT864(0));
        auVar18 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar10),ZEXT864(0));
        auVar17 = vfmadd213ps_avx512f(auVar18,auVar16,auVar17);
        *(undefined1 (*) [64])((long)pvVar5 + lVar10) = auVar17;
      }
      iVar8 = iVar9 * 0x10;
      uVar12 = (long)(iVar11 + iVar9 * -0x10) / 8;
      iVar9 = (int)uVar12;
      fVar19 = auVar16._0_4_;
      auVar21._4_4_ = fVar19;
      auVar21._0_4_ = fVar19;
      auVar21._8_4_ = fVar19;
      auVar21._12_4_ = fVar19;
      auVar21._16_4_ = fVar19;
      auVar21._20_4_ = fVar19;
      auVar21._24_4_ = fVar19;
      auVar21._28_4_ = fVar19;
      lVar10 = 0;
      uVar14 = 0;
      if (0 < iVar9) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
        auVar25 = *(undefined1 (*) [32])((long)pvVar5 + lVar10 + (long)iVar8 * 4);
        auVar24 = vmaxps_avx(auVar25,ZEXT1632(ZEXT816(0) << 0x40));
        auVar25 = vminps_avx(auVar25,ZEXT1632(ZEXT816(0) << 0x40));
        auVar23 = vfmadd213ps_fma(auVar25,auVar21,auVar24);
        *(undefined1 (*) [32])((long)pvVar5 + lVar10 + (long)iVar8 * 4) = ZEXT1632(auVar23);
      }
      iVar8 = iVar8 + iVar9 * 8;
      uVar12 = (long)(iVar11 - iVar8) / 4;
      auVar20._4_4_ = fVar19;
      auVar20._0_4_ = fVar19;
      auVar20._8_4_ = fVar19;
      auVar20._12_4_ = fVar19;
      lVar10 = 0;
      iVar9 = (int)uVar12;
      uVar14 = 0;
      if (0 < iVar9) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        auVar23 = *(undefined1 (*) [16])((long)pvVar5 + lVar10 + (long)iVar8 * 4);
        auVar22 = vmaxps_avx(auVar23,ZEXT416(0) << 0x40);
        auVar23 = vminps_avx(auVar23,ZEXT416(0) << 0x40);
        auVar23 = vfmadd213ps_fma(auVar23,auVar20,auVar22);
        *(undefined1 (*) [16])((long)pvVar5 + lVar10 + (long)iVar8 * 4) = auVar23;
      }
      for (lVar10 = (long)(iVar8 + iVar9 * 4); lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar1 = *(float *)((long)pvVar5 + lVar10 * 4);
        if (fVar1 < 0.0) {
          *(float *)((long)pvVar5 + lVar10 * 4) = fVar1 * fVar19;
        }
      }
    }
    else {
      iVar9 = (int)((long)iVar11 / 0x10);
      lVar10 = 0;
      uVar12 = 0;
      if (0 < iVar9) {
        uVar12 = (long)iVar11 / 0x10 & 0xffffffff;
      }
      for (; uVar12 * 0x40 != lVar10; lVar10 = lVar10 + 0x40) {
        auVar16 = vmaxps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar10),ZEXT1264(ZEXT812(0)))
        ;
        auVar17 = vminps_avx512f(*(undefined1 (*) [64])((long)pvVar5 + lVar10),ZEXT1264(ZEXT812(0)))
        ;
        auVar16 = vfmadd132ps_avx512f(auVar17,auVar16,*(undefined1 (*) [64])((long)puVar6 + lVar10))
        ;
        *(undefined1 (*) [64])((long)pvVar5 + lVar10) = auVar16;
      }
      uVar12 = (long)(iVar11 + iVar9 * -0x10) / 8;
      iVar8 = (int)uVar12;
      lVar15 = (long)(iVar9 * 0x10);
      lVar10 = 0;
      uVar14 = 0;
      if (0 < iVar8) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x20 != lVar10; lVar10 = lVar10 + 0x20) {
        auVar25 = *(undefined1 (*) [32])((long)pvVar5 + lVar10 + lVar15 * 4);
        auVar24 = vmaxps_avx(auVar25,ZEXT432(0) << 0x20);
        auVar25 = vminps_avx(auVar25,ZEXT432(0) << 0x20);
        auVar23 = vfmadd132ps_fma(auVar25,auVar24,
                                  *(undefined1 (*) [32])((long)puVar6 + lVar10 + lVar15 * 4));
        *(undefined1 (*) [32])((long)pvVar5 + lVar10 + lVar15 * 4) = ZEXT1632(auVar23);
      }
      iVar9 = iVar9 * 0x10 + iVar8 * 8;
      uVar12 = (long)(iVar11 - iVar9) / 4;
      lVar15 = (long)iVar9;
      lVar10 = 0;
      iVar8 = (int)uVar12;
      uVar14 = 0;
      if (0 < iVar8) {
        uVar14 = uVar12 & 0xffffffff;
      }
      for (; uVar14 * 0x10 != lVar10; lVar10 = lVar10 + 0x10) {
        auVar23 = *(undefined1 (*) [16])((long)pvVar5 + lVar10 + lVar15 * 4);
        auVar22 = vmaxps_avx(auVar23,ZEXT416(0) << 0x20);
        auVar23 = vminps_avx(auVar23,ZEXT416(0) << 0x20);
        auVar23 = vfmadd132ps_fma(auVar23,auVar22,
                                  *(undefined1 (*) [16])((long)puVar6 + lVar10 + lVar15 * 4));
        *(undefined1 (*) [16])((long)pvVar5 + lVar10 + lVar15 * 4) = auVar23;
      }
      for (lVar10 = (long)(iVar9 + iVar8 * 4); lVar10 < iVar11; lVar10 = lVar10 + 1) {
        fVar19 = *(float *)((long)pvVar5 + lVar10 * 4);
        if (fVar19 < 0.0) {
          *(float *)((long)pvVar5 + lVar10 * 4) =
               fVar19 * *(float *)(*(long *)(&this->field_0xd8 + (long)pp_Var3[-3]) + lVar10 * 4);
        }
      }
    }
  }
  return 0;
}

Assistant:

int PReLU_x86_avx512::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int dims = bottom_top_blob.dims;
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;

    if (dims == 1)
    {
        const int size = w * elempack;

        if (num_slope > 1)
        {
            float* ptr = bottom_top_blob;
            const float* slope = slope_data;

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_loadu_ps(slope + i);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_loadu_ps(slope + i);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_load_ps(slope + i);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope_data[i];
            }
        }
        else
        {
            float* ptr = bottom_top_blob;
            const float slope = slope_data[0];

            int nn_size = 0;
            int remain_size_start = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
            nn_size = (size - remain_size_start) / 16;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 16;
                __m512 _p512 = _mm512_loadu_ps(ptr + i);
                __m512 _slope512 = _mm512_set1_ps(slope);
                _mm512_storeu_ps(ptr + i, prelu_avx512(_p512, _slope512));
            }
            remain_size_start += nn_size * 16;
#endif // __AVX512F__
            nn_size = (size - remain_size_start) / 8;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 8;
                __m256 _p256 = _mm256_loadu_ps(ptr + i);
                __m256 _slope256 = _mm256_set1_ps(slope);
                _mm256_storeu_ps(ptr + i, prelu_avx(_p256, _slope256));
            }
            remain_size_start += nn_size * 8;
#endif // __AVX__
            nn_size = (size - remain_size_start) / 4;
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int ii = 0; ii < nn_size; ii++)
            {
                int i = remain_size_start + ii * 4;
                __m128 _p128 = _mm_load_ps(ptr + i);
                __m128 _slope128 = _mm_set1_ps(slope);
                _mm_store_ps(ptr + i, prelu_sse(_p128, _slope128));
            }
            remain_size_start += nn_size * 4;
#endif // __SSE2__
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = remain_size_start; i < size; i++)
            {
                if (ptr[i] < 0)
                    ptr[i] *= slope;
            }
        }
    }

    if (dims == 2)
    {
        const int size = w * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int i = 0; i < h; i++)
        {
            float* ptr = bottom_top_blob.row(i);
            int j = 0;

            float slope = num_slope > 1 ? slope_data[i] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + i * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + i * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + i * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; j + 15 < size; j += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; j + 7 < size; j += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; j + 3 < size; j += 4)
            {
                __m128 _p128 = _mm_loadu_ps(ptr);
                _mm_storeu_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; j < size; j++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    if (dims == 3)
    {
        const int size = w * h * elempack;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);
            int i = 0;

            float slope = num_slope > 1 ? slope_data[q] : slope_data[0];
#if __SSE2__
            __m128 _slope128 = num_slope > 1 && (elempack == 4) ? _mm_load_ps((const float*)slope_data + q * 4) : _mm_set1_ps(slope);
#if __AVX__
            __m256 _slope256 = num_slope > 1 && (elempack == 8) ? _mm256_loadu_ps((const float*)slope_data + q * 8) : _mm256_insertf128_ps(_mm256_castps128_ps256(_slope128), _slope128, 1);
#if __AVX512F__
            __m512 _slope512 = num_slope > 1 && (elempack == 16) ? _mm512_loadu_ps((const float*)slope_data + q * 16) : _mm512_insertf32x8(_mm512_castps256_ps512(_slope256), _slope256, 1);

            for (; i + 15 < size; i += 16)
            {
                __m512 _p512 = _mm512_loadu_ps(ptr);
                _mm512_storeu_ps(ptr, prelu_avx512(_p512, _slope512));
                ptr += 16;
            }
#endif // __AVX512F__
            for (; i + 7 < size; i += 8)
            {
                __m256 _p256 = _mm256_loadu_ps(ptr);
                _mm256_storeu_ps(ptr, prelu_avx(_p256, _slope256));
                ptr += 8;
            }
#endif // __AVX__
            for (; i + 3 < size; i += 4)
            {
                __m128 _p128 = _mm_load_ps(ptr);
                _mm_store_ps(ptr, prelu_sse(_p128, _slope128));
                ptr += 4;
            }
#endif // __SSE2__
            for (; i < size; i++)
            {
                if (*ptr < 0)
                    *ptr *= slope;
                ptr++;
            }
        }
    }

    return 0;
}